

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall
DIntermissionController::DIntermissionController
          (DIntermissionController *this,FIntermissionDescriptor *Desc,bool DeleteDesc,BYTE state)

{
  bool bVar1;
  BYTE state_local;
  bool DeleteDesc_local;
  FIntermissionDescriptor *Desc_local;
  DIntermissionController *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009ec4f8;
  TObjPtr<DIntermissionScreen>::TObjPtr(&this->mScreen);
  this->mDesc = Desc;
  this->mDeleteDesc = DeleteDesc;
  this->mIndex = 0;
  this->mAdvance = false;
  this->mSentAdvance = false;
  TObjPtr<DIntermissionScreen>::operator=(&this->mScreen,(DIntermissionScreen *)0x0);
  this->mFirst = true;
  this->mGameState = state;
  bVar1 = NextPage(this);
  if (!bVar1) {
    wipegamestate = GS_FINALE;
  }
  return;
}

Assistant:

DIntermissionController::DIntermissionController(FIntermissionDescriptor *Desc, bool DeleteDesc, BYTE state)
{
	mDesc = Desc;
	mDeleteDesc = DeleteDesc;
	mIndex = 0;
	mAdvance = false;
	mSentAdvance = false;
	mScreen = NULL;
	mFirst = true;
	mGameState = state;

	// If the intermission finishes straight away then cancel the wipe.
	if(!NextPage())
		wipegamestate = GS_FINALE;
}